

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O3

int Res_WinFinalizeRoots(Res_Win_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  Vec_Ptr_t *vRoots;
  int iVar4;
  int in_EDX;
  int Fill;
  
  pAVar2 = p->pNode;
  pAVar3 = pAVar2->pNtk;
  iVar4 = pAVar2->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar4 + 1,in_EDX);
  if (((long)iVar4 < 0) || ((pAVar3->vTravIds).nSize <= iVar4)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((pAVar3->vTravIds).pArray[iVar4] == pAVar2->pNtk->nTravIds) {
    __assert_fail("!Abc_NodeIsTravIdCurrent(p->pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resWin.c"
                  ,0x159,"int Res_WinFinalizeRoots(Res_Win_t *)");
  }
  pAVar3 = p->pNode->pNtk;
  iVar4 = p->pNode->Id;
  iVar1 = pAVar3->nTravIds;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar4 + 1,Fill);
  if ((-1 < (long)iVar4) && (iVar4 < (pAVar3->vTravIds).nSize)) {
    (pAVar3->vTravIds).pArray[iVar4] = iVar1;
    vRoots = p->vRoots;
    vRoots->nSize = 0;
    Res_WinFinalizeRoots_rec(p->pNode,vRoots);
    iVar4 = p->vRoots->nSize;
    if (0 < iVar4) {
      if ((iVar4 == 1) && ((Abc_Obj_t *)*p->vRoots->pArray == p->pNode)) {
        iVar4 = 0;
      }
      else {
        iVar4 = 1;
      }
      return iVar4;
    }
    __assert_fail("Vec_PtrSize(p->vRoots) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resWin.c"
                  ,0x15f,"int Res_WinFinalizeRoots(Res_Win_t *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

int Res_WinFinalizeRoots( Res_Win_t * p )
{
    assert( !Abc_NodeIsTravIdCurrent(p->pNode) );
    // mark the node with the old traversal ID
    Abc_NodeSetTravIdCurrent( p->pNode ); 
    // recollect the roots
    Vec_PtrClear( p->vRoots );
    Res_WinFinalizeRoots_rec( p->pNode, p->vRoots );
    assert( Vec_PtrSize(p->vRoots) > 0 );
    if ( Vec_PtrSize(p->vRoots) == 1 && Vec_PtrEntry(p->vRoots, 0) == p->pNode )
        return 0;
    return 1;
}